

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall XPMP2::SoundSystemXP::Stop(SoundSystemXP *this,uint64_t sndId)

{
  SoundChannel *pSVar1;
  SoundSystem *in_RDI;
  SoundChannel *pChn;
  uint64_t in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar2;
  uint64_t in_stack_fffffffffffffef0;
  allocator<char> local_f9;
  string local_f8 [8];
  FmodError *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  allocator<char> local_d1;
  string local_d0 [24];
  string *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  FMOD_RESULT in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  FmodError *in_stack_ffffffffffffff70;
  
  pSVar1 = SoundSystem::GetChn(in_RDI,in_stack_fffffffffffffef0);
  if ((((gpXPLMStopAudio != (code *)0x0) && (pSVar1 != (SoundChannel *)0x0)) &&
      (pSVar1->pChn != (FMOD_CHANNEL *)0x0)) && (pSVar1 != (SoundChannel *)0x0)) {
    if ((gpXPLMStopAudio == (code *)0x0) || (pSVar1->pChn == (FMOD_CHANNEL *)0x0)) {
      SoundSystem::RemoveChn
                ((SoundSystem *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
    }
    else {
      gFmodRes = (*gpXPLMStopAudio)(pSVar1->pChn);
      if (gFmodRes != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (allocator<char> *)in_stack_ffffffffffffff10);
        iVar2 = gFmodRes;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (allocator<char> *)in_stack_ffffffffffffff10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (allocator<char> *)in_stack_ffffffffffffff10);
        FmodError::FmodError
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
        FmodError::LogErr(in_stack_ffffffffffffff10);
        FmodError::~FmodError((FmodError *)CONCAT44(iVar2,in_stack_fffffffffffffee0));
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator(&local_f9);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator(&local_d1);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
      }
    }
  }
  return;
}

Assistant:

void SoundSystemXP::Stop (uint64_t sndId)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!gpXPLMStopAudio || !pChn || !pChn->pChn) return;
    if (!pChn) return;

    // Stop the channel (callback will be called and will remove tracking)
    if (gpXPLMStopAudio && pChn->pChn) {
        FMOD_LOG(gpXPLMStopAudio(pChn->pChn))
    } else {
        RemoveChn(sndId);
    }
}